

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  FILE *__stream;
  undefined8 uVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  CURLM *curl;
  bool bVar10;
  timeval newer;
  curl_socket_t maxFd;
  FILE *local_210;
  timeval tv;
  timeval timeout;
  ReadWriteSockets sockets;
  fd_set writeSet;
  int numMessages;
  stat file_info;
  
  sockets.write.sockets = (curl_socket_t *)0x0;
  sockets.write.count = 0;
  sockets.write.max_count = 0;
  sockets.read.sockets = (curl_socket_t *)0x0;
  sockets.read.count = 0;
  sockets.read.max_count = 0;
  timeout.tv_sec = -1;
  timeout.tv_usec = 0;
  tv_test_start = tutil_tvnow();
  if (libtest_arg3 == (char *)0x0) {
    curl_mfprintf(_stderr,"Usage: lib582 [url] [filename] [username]\n");
    iVar1 = 0x76;
    goto LAB_001024cb;
  }
  __stream = fopen64(libtest_arg2,"rb");
  uVar8 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar7 = strerror(iVar1);
    curl_mfprintf(uVar8,"fopen() failed with error: %d (%s)\n",iVar1,pcVar7);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg2);
    iVar1 = 0x75;
    goto LAB_001024cb;
  }
  iVar1 = fileno(__stream);
  iVar1 = fstat64(iVar1,(stat64 *)&file_info);
  uVar8 = _stderr;
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    pcVar7 = strerror(iVar1);
    curl_mfprintf(uVar8,"fstat() failed with error: %d (%s)\n",iVar1,pcVar7);
    curl_mfprintf(_stderr,"ERROR: cannot open file (%s)\n",libtest_arg2);
    fclose(__stream);
    iVar1 = 0x74;
    goto LAB_001024cb;
  }
  local_210 = __stream;
  curl_mfprintf(_stderr,"Set to upload %d bytes\n",file_info.st_size & 0xffffffff);
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                  ,0x108,iVar1,uVar2);
    fclose(local_210);
    goto LAB_001024cb;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl = (CURLM *)0x0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                  ,0x10e);
    iVar1 = 0x7c;
    goto LAB_001027ae;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2e,1);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x114;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x117;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2719,local_210);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x11a;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2715,libtest_arg3);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x11c;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x27a8,"curl_client_key.pub");
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x11d;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x27a9,"curl_client_key");
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x11e;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x51,0);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x11f;
      goto LAB_001027a1;
    }
    iVar1 = curl_easy_setopt(lVar3,0x75a3,file_info.st_size);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      curl = (CURLM *)0x0;
      uVar6 = 0x121;
      goto LAB_001027a1;
    }
    curl = (CURLM *)curl_multi_init();
    if (curl != (CURLM *)0x0) {
      iVar1 = curl_multi_setopt(curl,0x4e21,curlSocketCallback);
      uVar8 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_multi_setopt(curl,0x2712,&sockets);
        uVar8 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_multi_setopt(curl,0x4e24,curlTimerCallback);
          uVar8 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_multi_setopt(curl,0x2715,&timeout);
            uVar8 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_multi_add_handle(curl,lVar3);
              uVar8 = _stderr;
              if (iVar1 == 0) {
                do {
                  bVar9 = true;
                  bVar10 = false;
                  while( true ) {
                    piVar4 = (int *)curl_multi_info_read(curl,(fd_set *)&numMessages);
                    if (piVar4 == (int *)0x0) break;
                    if (*piVar4 == 1) {
                      bVar10 = piVar4[4] == 0;
                      bVar9 = false;
                    }
                    else {
                      bVar10 = false;
                      curl_mfprintf(_stderr,"Got an unexpected message from curl: %i\n");
                      bVar9 = false;
                    }
                  }
                  if (!bVar9) {
                    iVar1 = 0;
                    if (!bVar10) {
                      curl_mfprintf(_stderr,"Error uploading file.\n");
                      iVar1 = 0x7e;
                    }
                    goto LAB_001027ae;
                  }
                  maxFd = 0;
                  tv.tv_sec = 10;
                  tv.tv_usec = 0;
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    (&numMessages + lVar5 * 2)[0] = 0;
                    (&numMessages + lVar5 * 2)[1] = 0;
                  }
                  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
                    writeSet.__fds_bits[lVar5] = 0;
                  }
                  updateFdSet(&sockets.read,(fd_set *)&numMessages,&maxFd);
                  updateFdSet(&sockets.write,&writeSet,&maxFd);
                  if (timeout.tv_sec == -1) {
                    if (maxFd < 1) {
                      tv.tv_sec = 0;
                      tv.tv_usec = 100000;
                    }
                  }
                  else {
                    iVar1 = getMicroSecondTimeout(&timeout);
                    tv.tv_sec = (__time_t)(iVar1 / 1000000);
                    tv.tv_usec = (__suseconds_t)(iVar1 % 1000000);
                  }
                  iVar1 = select_wrapper(maxFd,(fd_set *)&numMessages,&writeSet,(fd_set *)0x0,&tv);
                  if (iVar1 == -1) {
                    piVar4 = __errno_location();
                    uVar8 = _stderr;
                    iVar1 = *piVar4;
                    pcVar7 = strerror(iVar1);
                    curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                                  ,0x141,iVar1,pcVar7);
                    iVar1 = 0x79;
                    goto LAB_001027ae;
                  }
                  checkFdSet(curl,&sockets.read,(fd_set *)&numMessages,1,"read");
                  checkFdSet(curl,&sockets.write,&writeSet,2,"write");
                  if (timeout.tv_sec != -1) {
                    iVar1 = getMicroSecondTimeout(&timeout);
                    if (iVar1 == 0) {
                      notifyCurl(curl,-1,0,"timeout");
                    }
                  }
                  newer = tutil_tvnow();
                  lVar5 = tutil_tvdiff(newer,tv_test_start);
                } while (lVar5 < 0xea61);
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                              ,0x14c);
                iVar1 = 0x7d;
                goto LAB_001027ae;
              }
              uVar2 = curl_multi_strerror(iVar1);
              pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
              uVar6 = 299;
            }
            else {
              uVar2 = curl_multi_strerror(iVar1);
              pcVar7 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
              uVar6 = 0x129;
            }
          }
          else {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
            uVar6 = 0x128;
          }
        }
        else {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
          uVar6 = 0x126;
        }
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
        uVar6 = 0x125;
      }
      goto LAB_001027a1;
    }
    curl = (CURLM *)0x0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                  ,0x123);
    iVar1 = 0x7b;
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    curl = (CURLM *)0x0;
    uVar6 = 0x111;
LAB_001027a1:
    curl_mfprintf(uVar8,pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib582.c"
                  ,uVar6,iVar1,uVar2);
  }
LAB_001027ae:
  curl_multi_remove_handle(curl,lVar3);
  curl_easy_cleanup(lVar3);
  curl_multi_cleanup(curl);
  curl_global_cleanup();
  fclose(local_210);
  free(sockets.read.sockets);
  free(sockets.write.sockets);
LAB_001024cb:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  FILE *hd_src = NULL;
  int hd;
  struct_stat file_info;
  CURLM *m = NULL;
  struct ReadWriteSockets sockets = {{NULL, 0, 0}, {NULL, 0, 0}};
  struct timeval timeout = {-1, 0};
  int success = 0;

  start_test_timing();

  if(!libtest_arg3) {
    fprintf(stderr, "Usage: lib582 [url] [filename] [username]\n");
    return TEST_ERR_USAGE;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg2);
    return TEST_ERR_FOPEN;
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    fprintf(stderr, "fstat() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "ERROR: cannot open file (%s)\n", libtest_arg2);
    fclose(hd_src);
    return TEST_ERR_FSTAT;
  }
  fprintf(stderr, "Set to upload %d bytes\n", (int)file_info.st_size);

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(hd_src);
    return res;
  }

  easy_init(curl);

  /* enable uploading */
  easy_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* specify target */
  easy_setopt(curl, CURLOPT_URL, URL);

  /* go verbose */
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* now specify which file to upload */
  easy_setopt(curl, CURLOPT_READDATA, hd_src);

  easy_setopt(curl, CURLOPT_USERPWD, libtest_arg3);
  easy_setopt(curl, CURLOPT_SSH_PUBLIC_KEYFILE, "curl_client_key.pub");
  easy_setopt(curl, CURLOPT_SSH_PRIVATE_KEYFILE, "curl_client_key");
  easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0L);

  easy_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t)file_info.st_size);

  multi_init(m);

  multi_setopt(m, CURLMOPT_SOCKETFUNCTION, curlSocketCallback);
  multi_setopt(m, CURLMOPT_SOCKETDATA, &sockets);

  multi_setopt(m, CURLMOPT_TIMERFUNCTION, curlTimerCallback);
  multi_setopt(m, CURLMOPT_TIMERDATA, &timeout);

  multi_add_handle(m, curl);

  while(!checkForCompletion(m, &success)) {
    fd_set readSet, writeSet;
    curl_socket_t maxFd = 0;
    struct timeval tv = {10, 0};

    FD_ZERO(&readSet);
    FD_ZERO(&writeSet);
    updateFdSet(&sockets.read, &readSet, &maxFd);
    updateFdSet(&sockets.write, &writeSet, &maxFd);

    if(timeout.tv_sec != -1) {
      int usTimeout = getMicroSecondTimeout(&timeout);
      tv.tv_sec = usTimeout / 1000000;
      tv.tv_usec = usTimeout % 1000000;
    }
    else if(maxFd <= 0) {
      tv.tv_sec = 0;
      tv.tv_usec = 100000;
    }

    select_test((int)maxFd, &readSet, &writeSet, NULL, &tv);

    /* Check the sockets for reading / writing */
    checkFdSet(m, &sockets.read, &readSet, CURL_CSELECT_IN, "read");
    checkFdSet(m, &sockets.write, &writeSet, CURL_CSELECT_OUT, "write");

    if(timeout.tv_sec != -1 && getMicroSecondTimeout(&timeout) == 0) {
      /* Curl's timer has elapsed. */
      notifyCurl(m, CURL_SOCKET_TIMEOUT, 0, "timeout");
    }

    abort_on_test_timeout();
  }

  if(!success) {
    fprintf(stderr, "Error uploading file.\n");
    res = TEST_ERR_MAJOR_BAD;
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  curl_multi_remove_handle(m, curl);
  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  /* close the local file */
  fclose(hd_src);

  /* free local memory */
  free(sockets.read.sockets);
  free(sockets.write.sockets);

  return res;
}